

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O2

void crnlib::console::add_console_output_func(console_output_func pFunc,void *pData)

{
  scoped_mutex lock;
  scoped_mutex local_28;
  console_func local_20;
  
  init((EVP_PKEY_CTX *)pFunc);
  local_28.m_mutex = m_pMutex;
  mutex::lock(m_pMutex);
  local_20.m_func = pFunc;
  local_20.m_pData = pData;
  vector<crnlib::console::console_func>::push_back
            ((vector<crnlib::console::console_func> *)&m_output_funcs,&local_20);
  scoped_mutex::~scoped_mutex(&local_28);
  return;
}

Assistant:

void console::add_console_output_func(console_output_func pFunc, void* pData) {
  init();

  scoped_mutex lock(*m_pMutex);

  m_output_funcs.push_back(console_func(pFunc, pData));
}